

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

golf_transform_t *
golf_transform_apply_movement
          (golf_transform_t *__return_storage_ptr__,golf_transform_t transform,
          golf_movement_t movement,float t)

{
  golf_transform_t gVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  quat qVar9;
  
  gVar1 = transform;
  fVar3 = fmodf(t + movement.t0,movement.length);
  (__return_storage_ptr__->scale).y = transform.scale.y;
  (__return_storage_ptr__->scale).z = transform.scale.z;
  (__return_storage_ptr__->rotation).y = transform.rotation.y;
  (__return_storage_ptr__->rotation).z = transform.rotation.z;
  *(long *)&(__return_storage_ptr__->rotation).w = gVar1._24_8_;
  (__return_storage_ptr__->position).x = transform.position.x;
  (__return_storage_ptr__->position).y = transform.position.y;
  *(long *)&(__return_storage_ptr__->position).z = gVar1._8_8_;
  vVar8 = movement.field_4._12_12_;
  switch(movement.type) {
  case GOLF_MOVEMENT_LINEAR:
    uVar2 = -(uint)(fVar3 < movement.length * 0.5);
    vVar8 = vec3_interpolate(movement.field_4._0_12_,vVar8,
                             (float)(uVar2 & (uint)fVar3 | ~uVar2 & (uint)(movement.length - fVar3))
                             / (movement.length * 0.5));
    vVar8 = vec3_add(gVar1.position,vVar8);
    __return_storage_ptr__->position = vVar8;
    return __return_storage_ptr__;
  case GOLF_MOVEMENT_SPINNER:
    vVar8 = vec3_create(0.0,1.0,0.0);
    fVar7 = (fVar3 / movement.length) * 6.2831855;
    break;
  case GOLF_MOVEMENT_PENDULUM:
    fVar3 = fVar3 / movement.length + fVar3 / movement.length;
    fVar3 = cosf((float)(~-(uint)(fVar3 < 1.0) & (uint)(2.0 - fVar3) |
                        (uint)fVar3 & -(uint)(fVar3 < 1.0)) * 3.1415927);
    vVar8 = movement.field_4._4_12_;
    fVar7 = movement.field_4.linear.p0.x * fVar3;
    break;
  case GOLF_MOVEMENT_RAMP:
    fVar4 = (movement.field_4.linear.p0.x / 360.0) * 6.2831855;
    fVar7 = fVar4;
    if (movement.field_4.linear.p0.z <= fVar3) {
      fVar5 = (movement.field_4.linear.p0.y / 360.0) * 6.2831855;
      fVar7 = movement.length * 0.5 - movement.field_4.linear.p0.z;
      if (fVar7 <= fVar3) {
        fVar6 = movement.length * 0.5 + movement.field_4.linear.p0.z;
        fVar7 = fVar5;
        if ((fVar3 < fVar6) ||
           (fVar7 = fVar4, movement.length - movement.field_4.linear.p0.z <= fVar3)) break;
        fVar4 = (fVar4 - fVar5) *
                ((fVar3 - fVar6) / ((movement.length - movement.field_4.linear.p0.z) - fVar6));
      }
      else {
        fVar5 = (fVar5 - fVar4) *
                ((fVar3 - movement.field_4.linear.p0.z) / (fVar7 - movement.field_4.linear.p0.z));
      }
      fVar7 = fVar4 + fVar5;
    }
    break;
  default:
    goto switchD_0012de8d_default;
  }
  qVar9 = quat_create_from_axis_angle(vVar8,fVar7);
  qVar9 = quat_multiply(qVar9,gVar1.rotation);
  __return_storage_ptr__->rotation = qVar9;
switchD_0012de8d_default:
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_transform_apply_movement(golf_transform_t transform, golf_movement_t movement, float t) {
    float l = movement.length;
    t = fmodf(movement.t0 + t, l);
    golf_transform_t new_transform = transform;
    switch (movement.type) {
        case GOLF_MOVEMENT_NONE:
            break;
        case GOLF_MOVEMENT_LINEAR: {
            vec3 p0 = movement.linear.p0;
            vec3 p1 = movement.linear.p1;
            vec3 p = transform.position;
            if (t < 0.5f * l) {
                p = vec3_add(p, vec3_interpolate(p0, p1, t / (0.5f * l)));
            }
            else {
                p = vec3_add(p, vec3_interpolate(p0, p1, (l - t) / (0.5f * l)));
            }
            new_transform.position = p;
            break;
        }
        case GOLF_MOVEMENT_SPINNER: {
            float a = 2 * MF_PI * (t / l);
            quat r = quat_create_from_axis_angle(V3(0, 1, 0), a);
            new_transform.rotation = quat_multiply(r, transform.rotation);
            break;
        }
        case GOLF_MOVEMENT_PENDULUM: {
            float a = 2 * (t / l);
            if (a >= 1) a = 2 - a;

            float theta = movement.pendulum.theta0 * cosf(MF_PI * a);
            quat r = quat_create_from_axis_angle(movement.pendulum.axis, theta);
            new_transform.rotation = quat_multiply(r, transform.rotation);
            break;
        }
        case GOLF_MOVEMENT_RAMP: {
            float theta0 = 2.0f * MF_PI * (movement.ramp.theta0 / 360.0f);
            float theta1 = 2.0f * MF_PI * (movement.ramp.theta1 / 360.0f);
            float transition_length = movement.ramp.transition_length;
            vec3 axis = movement.ramp.axis;
            float theta = 0;

            float s1 = transition_length;
            float s2 = 0.5f * l - transition_length;
            float s3 = 0.5f * l + transition_length;
            float s4 = l - transition_length;

            // stuck at bottom
            if (t < s1) {
                theta = theta0;
            }
            // going up
            else if (t < s2) {
                float a = (t - s1) / (s2 - s1);
                theta = theta0 + a * (theta1 - theta0);
            }
            // stuck at top
            else if (t < s3) {
                theta = theta1;
            }
            // going down
            else if (t < s4) {
                float a = (t - s3) / (s4 - s3);
                theta = theta1 + a * (theta0 - theta1);
            }
            // stuck at bottom
            else {
                theta = theta0;
            }

            quat r = quat_create_from_axis_angle(axis, theta);
            new_transform.rotation = quat_multiply(r, transform.rotation);

            break;
        }
    }
    return new_transform;
}